

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O3

void vera::splitFacesFromVerticalCross<float>
               (float *_data,size_t _width,size_t _height,size_t _channels,
               CubemapFace<float> **_faces)

{
  CubemapFace<float> *pCVar1;
  float *pfVar2;
  ulong uVar3;
  CubemapFace<float> **ppCVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  
  uVar9 = _width / 3;
  iVar8 = (int)uVar9;
  iVar6 = (int)(_height >> 2);
  uVar3 = ((ulong)(uint)(iVar8 * iVar6) << 0x20) * 3;
  uVar10 = 0xffffffffffffffff;
  if (-1 < (long)uVar3) {
    uVar10 = uVar3 >> 0x1e;
  }
  lVar7 = 0;
  do {
    pCVar1 = (CubemapFace<float> *)operator_new(0x18);
    pCVar1->id = 0;
    pCVar1->width = 0;
    pCVar1->height = 0;
    pCVar1->currentOffset = 0;
    pCVar1->data = (float *)0x0;
    _faces[lVar7] = pCVar1;
    pCVar1->id = (int)lVar7;
    pfVar2 = (float *)operator_new__(uVar10);
    pCVar1->data = pfVar2;
    pCVar1->width = iVar8;
    pCVar1->height = iVar6;
    pCVar1->currentOffset = 0;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 6);
  if (_height != 0) {
    lVar7 = 0;
    uVar3 = 0;
    do {
      lVar11 = 1;
      lVar5 = lVar7;
      do {
        iVar12 = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                      (long)iVar6);
        ppCVar4 = _faces;
        if (((((iVar12 == 1 && lVar11 == -1) || (ppCVar4 = _faces + 1, iVar12 == 1 && lVar11 == 1))
             || (ppCVar4 = _faces + 2, iVar12 == 0 && lVar11 == 0)) ||
            (((ppCVar4 = _faces + 3, iVar12 == 2 && lVar11 == 0 ||
              (ppCVar4 = _faces + 4, iVar12 == 1 && lVar11 == 0)) ||
             (ppCVar4 = _faces + 5, iVar12 == 3 && lVar11 == 0)))) &&
           (pCVar1 = *ppCVar4, pCVar1 != (CubemapFace<float> *)0x0)) {
          memcpy(pCVar1->data + pCVar1->currentOffset,(void *)((lVar5 >> 0x1e) + (long)_data),
                 (long)((uVar9 << 0x22) * 3) >> 0x20);
          pCVar1->currentOffset = pCVar1->currentOffset + iVar8 * 3;
        }
        lVar11 = lVar11 + -1;
        lVar5 = lVar5 + uVar9 * 0x300000000;
      } while (lVar11 != -2);
      uVar3 = uVar3 + 1;
      lVar7 = lVar7 + _width * 0x300000000;
    } while (uVar3 != _height);
  }
  return;
}

Assistant:

void splitFacesFromVerticalCross(const T *_data, size_t _width, size_t _height, size_t _channels, CubemapFace<T> **_faces ) {
    int faceWidth = _width / 3;
    int faceHeight = _height / 4;

    for (int i = 0; i < 6; i++) {
        _faces[i] = new CubemapFace<T>();
        _faces[i]->id = i;
        _faces[i]->data = new T[3 * faceWidth * faceHeight];
        _faces[i]->width = faceWidth;
        _faces[i]->height = faceHeight;
        _faces[i]->currentOffset = 0;
    }

    for (int l = 0; l < _height; l++) {
        int jFace = (l - (l % faceHeight)) / faceHeight;

        for (int iFace = 0; iFace < 3; iFace++) {
            CubemapFace<T> *face = NULL;
            int offset = 3 * (faceWidth * iFace + l * _width);

            //      0   1   2   i
            //  3      -Z       
            //  2      -X 
            //  1  -Y  +Z  +Y       
            //  0      +X
            //  j
            //
            if (iFace == 2 && jFace == 1) face = _faces[0]; // POS_Y
            if (iFace == 0 && jFace == 1) face = _faces[1]; // NEG_Y
            if (iFace == 1 && jFace == 0) face = _faces[2]; // POS_X
            if (iFace == 1 && jFace == 2) face = _faces[3]; // NEG_X
            if (iFace == 1 && jFace == 1) face = _faces[4]; // POS_Z
            if (iFace == 1 && jFace == 3) face = _faces[5]; // NEG_Z

            if (face) {
                // the number of components to copy
                int n = sizeof(T) * faceWidth * 3;

                std::memcpy(face->data + face->currentOffset, _data + offset, n);
                face->currentOffset += (3 * faceWidth);
            }
        }
    }
}